

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeNF
          (ChElementBeamIGA *this,double U,ChVectorDynamic<> *Qi,double *detJ,ChVectorDynamic<> *F,
          ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  double dVar2;
  uint i;
  double *pdVar3;
  pointer psVar4;
  pointer psVar5;
  element_type *peVar6;
  double *pdVar7;
  ulong uVar8;
  double dVar9;
  long lVar10;
  ulong uVar11;
  char *__function;
  ulong uVar12;
  pointer psVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ChMatrixDynamic<> N;
  DenseStorage<double,__1,__1,__1,_1> local_58;
  double local_38;
  double local_30;
  
  i = this->order;
  lVar15 = (long)(int)i;
  if ((lVar15 < 0) ||
     (uVar11 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows, (long)uVar11 <= lVar15)) {
LAB_0068d471:
    __function = 
    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
    ;
LAB_0068d486:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,__function);
  }
  lVar10 = uVar11 + (long)(int)~i;
  if ((lVar10 < 0) || (!CARRY8(uVar11,(long)(int)~i))) goto LAB_0068d471;
  pdVar3 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  dVar16 = pdVar3[lVar15];
  local_38 = pdVar3[lVar10];
  local_58.m_cols = 0;
  lVar15 = (long)(int)((ulong)((long)(this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->nodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
  local_58.m_data = (double *)0x0;
  local_58.m_rows = 0;
  local_30 = U;
  if (lVar15 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_58,lVar15 * 2,2,lVar15);
  dVar9 = (local_38 - dVar16) * 0.5;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_30;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (dVar16 + local_38) * 0.5;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar9;
  auVar17 = vfmadd213sd_fma(auVar17,auVar21,auVar19);
  geometry::ChBasisToolsBspline::BasisEvaluateDeriv
            (this->order,i,auVar17._0_8_,&this->knots,(ChMatrixDynamic<> *)&local_58);
  psVar4 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar5 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)psVar4 - (long)psVar5;
  if (lVar15 == 0) {
    *detJ = dVar9 * 0.0;
  }
  else {
    if ((local_58.m_rows < 2) ||
       (lVar15 = lVar15 >> 4, uVar11 = lVar15 + (ulong)(lVar15 == 0),
       (ulong)(~(local_58.m_cols >> 0x3f) & local_58.m_cols) <= uVar11 - 1)) {
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                   );
    }
    dVar16 = 0.0;
    uVar12 = 0;
    psVar13 = psVar5;
    auVar17 = ZEXT816(0) << 0x40;
    do {
      peVar6 = (psVar13->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      dVar2 = local_58.m_data[local_58.m_cols + uVar12];
      uVar12 = uVar12 + 1;
      psVar13 = psVar13 + 1;
      auVar20._0_8_ = auVar17._0_8_ + dVar2 * (peVar6->X0).coord.pos.m_data[0];
      auVar20._8_8_ = auVar17._8_8_ + dVar2 * (peVar6->X0).coord.pos.m_data[1];
      dVar16 = dVar16 + dVar2 * (peVar6->X0).coord.pos.m_data[2];
      auVar17 = auVar20;
    } while (uVar11 != uVar12);
    auVar22._0_8_ = auVar20._0_8_ * auVar20._0_8_;
    auVar22._8_8_ = auVar20._8_8_ * auVar20._8_8_;
    auVar17 = vshufpd_avx(auVar22,auVar22,1);
    auVar17 = vfmadd231sd_fma(auVar17,auVar20,auVar20);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar16;
    auVar17 = vfmadd213sd_fma(auVar18,auVar18,auVar17);
    auVar17 = vsqrtsd_avx(auVar17,auVar17);
    *detJ = auVar17._0_8_ * dVar9;
    if (psVar4 != psVar5) {
      pdVar3 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar12 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      pdVar7 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar8 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      uVar14 = 0;
      lVar15 = 0;
      do {
        if ((~(local_58.m_cols * local_58.m_rows >> 0x3f) & local_58.m_cols * local_58.m_rows) ==
            uVar14) {
          __function = 
          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
          ;
          goto LAB_0068d486;
        }
        if ((long)uVar12 < 1) {
LAB_0068d490:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        if ((long)uVar8 <= lVar15) goto LAB_0068d471;
        pdVar7[lVar15] = local_58.m_data[uVar14] * *pdVar3;
        if (uVar12 == 1) goto LAB_0068d490;
        if (uVar8 <= lVar15 + 1U) goto LAB_0068d471;
        pdVar7[lVar15 + 1] = local_58.m_data[uVar14] * pdVar3[1];
        if (uVar12 < 3) goto LAB_0068d490;
        if (uVar8 <= lVar15 + 2U) goto LAB_0068d471;
        pdVar7[lVar15 + 2] = local_58.m_data[uVar14] * pdVar3[2];
        if (uVar12 == 3) goto LAB_0068d490;
        if (uVar8 <= lVar15 + 3U) goto LAB_0068d471;
        pdVar7[lVar15 + 3] = local_58.m_data[uVar14] * pdVar3[3];
        if (uVar12 < 5) goto LAB_0068d490;
        if (uVar8 <= lVar15 + 4U) goto LAB_0068d471;
        pdVar7[lVar15 + 4] = local_58.m_data[uVar14] * pdVar3[4];
        if (uVar12 == 5) goto LAB_0068d490;
        if (uVar8 <= lVar15 + 5U) goto LAB_0068d471;
        pdVar1 = local_58.m_data + uVar14;
        uVar14 = uVar14 + 1;
        pdVar7[lVar15 + 5] = *pdVar1 * pdVar3[5];
        lVar15 = lVar15 + 6;
      } while (uVar11 != uVar14);
      goto LAB_0068d45a;
    }
  }
  if (local_58.m_data == (double *)0x0) {
    return;
  }
LAB_0068d45a:
  free((void *)local_58.m_data[-1]);
  return;
}

Assistant:

void ChElementBeamIGA::ComputeNF(const double U,
                                 ChVectorDynamic<>& Qi,
                                 double& detJ,
                                 const ChVectorDynamic<>& F,
                                 ChVectorDynamic<>* state_x,
                                 ChVectorDynamic<>* state_w) {
    // get two values of absyssa at extreme of span
    double u1 = knots(order);
    double u2 = knots(knots.size() - order - 1);

    double c1 = (u2 - u1) / 2;
    double c2 = (u2 + u1) / 2;

    // absyssa in span range:
    double u = (c1 * U + c2);

    // compute the basis functions N(u) at given u:
    int nspan = order;

    ChMatrixDynamic<> N(2, (int)nodes.size());  // row n.0 contains N, row n.1 contains dN/du

    geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order, nspan, u, knots,
                                                      N);  ///< h

    ChVector<> dr0;
    for (int i = 0; i < nodes.size(); ++i) {
        dr0 += nodes[i]->GetX0ref().coord.pos * N(1, i);
    }
    detJ = dr0.Length() * c1;

    for (int i = 0; i < nodes.size(); ++i) {
        int stride = i * 6;
        Qi(stride + 0) = N(i) * F(0);
        Qi(stride + 1) = N(i) * F(1);
        Qi(stride + 2) = N(i) * F(2);
        Qi(stride + 3) = N(i) * F(3);
        Qi(stride + 4) = N(i) * F(4);
        Qi(stride + 5) = N(i) * F(5);
    }
}